

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeC.cpp
# Opt level: O0

longlong SoapySDR_ticksToTimeNs(longlong ticks,double rate)

{
  long lVar1;
  long lVar2;
  longlong lVar3;
  long in_RDI;
  double in_XMM0_Qa;
  double frac;
  double part;
  longlong err;
  longlong full;
  longlong ratell;
  
  lVar1 = (long)in_XMM0_Qa;
  lVar2 = in_RDI / lVar1;
  lVar3 = llround((((double)(in_RDI - lVar2 * lVar1) - (double)lVar2 * (in_XMM0_Qa - (double)lVar1))
                  * 1000000000.0) / in_XMM0_Qa);
  return lVar2 * 1000000000 + lVar3;
}

Assistant:

long long SoapySDR_ticksToTimeNs(const long long ticks, const double rate)
{
    const long long ratell = (long long)(rate);
    const long long full = (long long)(ticks/ratell);
    const long long err = ticks - (full*ratell);
    const double part = full*(rate - ratell);
    const double frac = ((err - part)*1000000000)/rate;
    return (full*1000000000) + llround(frac);
}